

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reshape.cpp
# Opt level: O1

int __thiscall
ncnn::Reshape::forward
          (Reshape *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Mat *this_00;
  Mat *pMVar5;
  int *piVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int outh;
  int outc;
  int outd;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  Mat local_78;
  
  this_00 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pMVar5 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_84 = this->w;
  local_88 = this->h;
  local_7c = this->d;
  local_80 = this->c;
  if ((this->shape_expr)._M_string_length != 0) {
    eval_shape_expr(this,bottom_blobs,&local_84,&local_88,&local_7c,&local_80);
  }
  iVar9 = this_00->dims;
  iVar1 = this_00->w;
  iVar2 = this_00->h;
  iVar3 = this_00->c;
  iVar8 = this_00->d * iVar3 * iVar2 * iVar1;
  iVar4 = this->ndim;
  if (iVar4 == 1) {
    if (local_84 == 0) {
      local_84 = iVar1;
    }
    if (local_84 == -1) {
      local_84 = iVar8;
    }
    if ((iVar9 == 1) && (iVar1 == local_84)) goto LAB_00345307;
  }
  if (iVar4 == 4) {
    if (local_84 != 0) {
      iVar1 = local_84;
    }
    if (local_88 != 0) {
      iVar2 = local_88;
    }
    if (local_80 == 0) {
      local_80 = iVar3;
    }
    iVar10 = this_00->d;
    if (local_7c != 0) {
      iVar10 = local_7c;
    }
    local_84 = iVar1;
    if (iVar1 == -1) {
      uVar7 = (long)((ulong)(uint)((int)((long)iVar8 / (long)local_80) >> 0x1f) << 0x20 |
                    (long)iVar8 / (long)local_80 & 0xffffffffU) / (long)iVar10;
      local_84 = (int)((long)((ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 | uVar7 & 0xffffffff) /
                      (long)iVar2);
    }
    local_88 = iVar2;
    if (iVar2 == -1) {
      uVar7 = (long)((ulong)(uint)((int)((long)iVar8 / (long)local_80) >> 0x1f) << 0x20 |
                    (long)iVar8 / (long)local_80 & 0xffffffffU) / (long)iVar10;
      local_88 = (int)((long)((ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 | uVar7 & 0xffffffff) /
                      (long)local_84);
    }
    local_7c = iVar10;
    if (iVar10 == -1) {
      uVar7 = (long)((ulong)(uint)((int)((long)iVar8 / (long)local_80) >> 0x1f) << 0x20 |
                    (long)iVar8 / (long)local_80 & 0xffffffffU) / (long)local_88;
      local_7c = (int)((long)((ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 | uVar7 & 0xffffffff) /
                      (long)local_84);
    }
    if (local_80 == -1) {
      uVar7 = (long)((ulong)(uint)((int)((long)iVar8 / (long)local_7c) >> 0x1f) << 0x20 |
                    (long)iVar8 / (long)local_7c & 0xffffffffU) / (long)local_88;
      local_80 = (int)((long)((ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 | uVar7 & 0xffffffff) /
                      (long)local_84);
    }
    if ((iVar9 == 4) && (iVar3 == local_80)) {
      if (pMVar5 != this_00) {
        piVar6 = this_00->refcount;
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + 1;
          UNLOCK();
        }
        piVar6 = pMVar5->refcount;
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if (pMVar5->allocator == (Allocator *)0x0) {
              if (pMVar5->data != (void *)0x0) {
                free(pMVar5->data);
              }
            }
            else {
              (*pMVar5->allocator->_vptr_Allocator[3])();
            }
          }
        }
        pMVar5->cstep = 0;
        pMVar5->data = (void *)0x0;
        pMVar5->refcount = (int *)0x0;
        *(undefined8 *)((long)&pMVar5->refcount + 4) = 0;
        *(undefined8 *)((long)&pMVar5->elemsize + 4) = 0;
        pMVar5->dims = 0;
        pMVar5->w = 0;
        pMVar5->h = 0;
        pMVar5->d = 0;
        pMVar5->c = 0;
        piVar6 = this_00->refcount;
        pMVar5->data = this_00->data;
        pMVar5->refcount = piVar6;
        pMVar5->elemsize = this_00->elemsize;
        pMVar5->elempack = this_00->elempack;
        pMVar5->allocator = this_00->allocator;
        iVar9 = this_00->w;
        iVar1 = this_00->h;
        iVar2 = this_00->d;
        pMVar5->dims = this_00->dims;
        pMVar5->w = iVar9;
        pMVar5->h = iVar1;
        pMVar5->d = iVar2;
        pMVar5->c = this_00->c;
        pMVar5->cstep = this_00->cstep;
      }
      pMVar5->w = local_84;
      pMVar5->h = local_88;
      pMVar5->d = local_7c;
      return 0;
    }
  }
  else if (iVar4 == 3) {
    if (local_84 == 0) {
      local_84 = iVar1;
    }
    if (local_88 == 0) {
      local_88 = iVar2;
    }
    if (local_80 == 0) {
      local_80 = iVar3;
    }
    if (local_84 == -1) {
      local_84 = (int)((long)((ulong)(uint)((int)((long)iVar8 / (long)local_80) >> 0x1f) << 0x20 |
                             (long)iVar8 / (long)local_80 & 0xffffffffU) / (long)local_88);
    }
    if (local_88 == -1) {
      local_88 = (int)((long)((ulong)(uint)((int)((long)iVar8 / (long)local_80) >> 0x1f) << 0x20 |
                             (long)iVar8 / (long)local_80 & 0xffffffffU) / (long)local_84);
    }
    if (local_80 == -1) {
      local_80 = (int)((long)((ulong)(uint)((int)((long)iVar8 / (long)local_88) >> 0x1f) << 0x20 |
                             (long)iVar8 / (long)local_88 & 0xffffffffU) / (long)local_84);
    }
    if ((iVar9 == 3) && (iVar3 == local_80)) {
      if (pMVar5 != this_00) {
        piVar6 = this_00->refcount;
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + 1;
          UNLOCK();
        }
        piVar6 = pMVar5->refcount;
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if (pMVar5->allocator == (Allocator *)0x0) {
              if (pMVar5->data != (void *)0x0) {
                free(pMVar5->data);
              }
            }
            else {
              (*pMVar5->allocator->_vptr_Allocator[3])();
            }
          }
        }
        pMVar5->cstep = 0;
        pMVar5->data = (void *)0x0;
        pMVar5->refcount = (int *)0x0;
        *(undefined8 *)((long)&pMVar5->refcount + 4) = 0;
        *(undefined8 *)((long)&pMVar5->elemsize + 4) = 0;
        pMVar5->dims = 0;
        pMVar5->w = 0;
        pMVar5->h = 0;
        pMVar5->d = 0;
        pMVar5->c = 0;
        piVar6 = this_00->refcount;
        pMVar5->data = this_00->data;
        pMVar5->refcount = piVar6;
        pMVar5->elemsize = this_00->elemsize;
        pMVar5->elempack = this_00->elempack;
        pMVar5->allocator = this_00->allocator;
        iVar9 = this_00->w;
        iVar1 = this_00->h;
        iVar2 = this_00->d;
        pMVar5->dims = this_00->dims;
        pMVar5->w = iVar9;
        pMVar5->h = iVar1;
        pMVar5->d = iVar2;
        pMVar5->c = this_00->c;
        pMVar5->cstep = this_00->cstep;
      }
      pMVar5->w = local_84;
      pMVar5->h = local_88;
      return 0;
    }
  }
  else if (iVar4 == 2) {
    if (local_84 == 0) {
      local_84 = iVar1;
    }
    if (local_88 == 0) {
      local_88 = iVar2;
    }
    if (local_84 == -1) {
      local_84 = iVar8 / local_88;
    }
    if (local_88 == -1) {
      local_88 = iVar8 / local_84;
    }
    if ((iVar9 == 2) && (iVar2 == local_88)) {
LAB_00345307:
      if (pMVar5 != this_00) {
        piVar6 = this_00->refcount;
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + 1;
          UNLOCK();
        }
        piVar6 = pMVar5->refcount;
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if (pMVar5->allocator == (Allocator *)0x0) {
              if (pMVar5->data != (void *)0x0) {
                free(pMVar5->data);
              }
            }
            else {
              (*pMVar5->allocator->_vptr_Allocator[3])();
            }
          }
        }
        pMVar5->cstep = 0;
        pMVar5->data = (void *)0x0;
        pMVar5->refcount = (int *)0x0;
        *(undefined8 *)((long)&pMVar5->refcount + 4) = 0;
        *(undefined8 *)((long)&pMVar5->elemsize + 4) = 0;
        pMVar5->dims = 0;
        pMVar5->w = 0;
        pMVar5->h = 0;
        pMVar5->d = 0;
        pMVar5->c = 0;
        piVar6 = this_00->refcount;
        pMVar5->data = this_00->data;
        pMVar5->refcount = piVar6;
        pMVar5->elemsize = this_00->elemsize;
        pMVar5->elempack = this_00->elempack;
        pMVar5->allocator = this_00->allocator;
        iVar9 = this_00->w;
        iVar1 = this_00->h;
        iVar2 = this_00->d;
        pMVar5->dims = this_00->dims;
        pMVar5->w = iVar9;
        pMVar5->h = iVar1;
        pMVar5->d = iVar2;
        pMVar5->c = this_00->c;
        pMVar5->cstep = this_00->cstep;
        return 0;
      }
      return 0;
    }
  }
  if (iVar4 == 1) {
    Mat::reshape(&local_78,this_00,local_84,opt->blob_allocator);
    if (pMVar5 != &local_78) {
      if (local_78.refcount != (int *)0x0) {
        LOCK();
        *local_78.refcount = *local_78.refcount + 1;
        UNLOCK();
      }
      piVar6 = pMVar5->refcount;
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          if (pMVar5->allocator == (Allocator *)0x0) {
            if (pMVar5->data != (void *)0x0) {
              free(pMVar5->data);
            }
          }
          else {
            (*pMVar5->allocator->_vptr_Allocator[3])();
          }
        }
      }
      pMVar5->cstep = 0;
      pMVar5->data = (void *)0x0;
      pMVar5->refcount = (int *)0x0;
      *(undefined8 *)((long)&pMVar5->refcount + 4) = 0;
      *(undefined8 *)((long)&pMVar5->elemsize + 4) = 0;
      pMVar5->dims = 0;
      pMVar5->w = 0;
      pMVar5->h = 0;
      pMVar5->d = 0;
      pMVar5->c = 0;
      pMVar5->data = local_78.data;
      pMVar5->refcount = local_78.refcount;
      pMVar5->elemsize = local_78.elemsize;
      pMVar5->elempack = local_78.elempack;
      pMVar5->allocator = local_78.allocator;
      pMVar5->dims = local_78.dims;
      pMVar5->w = local_78.w;
      pMVar5->h = local_78.h;
      pMVar5->d = local_78.d;
      pMVar5->c = local_78.c;
      pMVar5->cstep = local_78.cstep;
    }
    if (local_78.refcount != (int *)0x0) {
      LOCK();
      *local_78.refcount = *local_78.refcount + -1;
      UNLOCK();
      if (*local_78.refcount == 0) {
        if (local_78.allocator == (Allocator *)0x0) {
          if (local_78.data != (void *)0x0) {
            free(local_78.data);
          }
        }
        else {
          (*(local_78.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  if (this->ndim == 2) {
    Mat::reshape(&local_78,this_00,local_84,local_88,opt->blob_allocator);
    if (pMVar5 != &local_78) {
      if (local_78.refcount != (int *)0x0) {
        LOCK();
        *local_78.refcount = *local_78.refcount + 1;
        UNLOCK();
      }
      piVar6 = pMVar5->refcount;
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          if (pMVar5->allocator == (Allocator *)0x0) {
            if (pMVar5->data != (void *)0x0) {
              free(pMVar5->data);
            }
          }
          else {
            (*pMVar5->allocator->_vptr_Allocator[3])();
          }
        }
      }
      pMVar5->cstep = 0;
      pMVar5->data = (void *)0x0;
      pMVar5->refcount = (int *)0x0;
      *(undefined8 *)((long)&pMVar5->refcount + 4) = 0;
      *(undefined8 *)((long)&pMVar5->elemsize + 4) = 0;
      pMVar5->dims = 0;
      pMVar5->w = 0;
      pMVar5->h = 0;
      pMVar5->d = 0;
      pMVar5->c = 0;
      pMVar5->data = local_78.data;
      pMVar5->refcount = local_78.refcount;
      pMVar5->elemsize = local_78.elemsize;
      pMVar5->elempack = local_78.elempack;
      pMVar5->allocator = local_78.allocator;
      pMVar5->dims = local_78.dims;
      pMVar5->w = local_78.w;
      pMVar5->h = local_78.h;
      pMVar5->d = local_78.d;
      pMVar5->c = local_78.c;
      pMVar5->cstep = local_78.cstep;
    }
    if (local_78.refcount != (int *)0x0) {
      LOCK();
      *local_78.refcount = *local_78.refcount + -1;
      UNLOCK();
      if (*local_78.refcount == 0) {
        if (local_78.allocator == (Allocator *)0x0) {
          if (local_78.data != (void *)0x0) {
            free(local_78.data);
          }
        }
        else {
          (*(local_78.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  if (this->ndim == 3) {
    Mat::reshape(&local_78,this_00,local_84,local_88,local_80,opt->blob_allocator);
    if (pMVar5 != &local_78) {
      if (local_78.refcount != (int *)0x0) {
        LOCK();
        *local_78.refcount = *local_78.refcount + 1;
        UNLOCK();
      }
      piVar6 = pMVar5->refcount;
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          if (pMVar5->allocator == (Allocator *)0x0) {
            if (pMVar5->data != (void *)0x0) {
              free(pMVar5->data);
            }
          }
          else {
            (*pMVar5->allocator->_vptr_Allocator[3])();
          }
        }
      }
      pMVar5->cstep = 0;
      pMVar5->data = (void *)0x0;
      pMVar5->refcount = (int *)0x0;
      *(undefined8 *)((long)&pMVar5->refcount + 4) = 0;
      *(undefined8 *)((long)&pMVar5->elemsize + 4) = 0;
      pMVar5->dims = 0;
      pMVar5->w = 0;
      pMVar5->h = 0;
      pMVar5->d = 0;
      pMVar5->c = 0;
      pMVar5->data = local_78.data;
      pMVar5->refcount = local_78.refcount;
      pMVar5->elemsize = local_78.elemsize;
      pMVar5->elempack = local_78.elempack;
      pMVar5->allocator = local_78.allocator;
      pMVar5->dims = local_78.dims;
      pMVar5->w = local_78.w;
      pMVar5->h = local_78.h;
      pMVar5->d = local_78.d;
      pMVar5->c = local_78.c;
      pMVar5->cstep = local_78.cstep;
    }
    if (local_78.refcount != (int *)0x0) {
      LOCK();
      *local_78.refcount = *local_78.refcount + -1;
      UNLOCK();
      if (*local_78.refcount == 0) {
        if (local_78.allocator == (Allocator *)0x0) {
          if (local_78.data != (void *)0x0) {
            free(local_78.data);
          }
        }
        else {
          (*(local_78.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  if (this->ndim == 4) {
    Mat::reshape(&local_78,this_00,local_84,local_88,local_7c,local_80,opt->blob_allocator);
    if (pMVar5 != &local_78) {
      if (local_78.refcount != (int *)0x0) {
        LOCK();
        *local_78.refcount = *local_78.refcount + 1;
        UNLOCK();
      }
      piVar6 = pMVar5->refcount;
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          if (pMVar5->allocator == (Allocator *)0x0) {
            if (pMVar5->data != (void *)0x0) {
              free(pMVar5->data);
            }
          }
          else {
            (*pMVar5->allocator->_vptr_Allocator[3])();
          }
        }
      }
      pMVar5->cstep = 0;
      pMVar5->data = (void *)0x0;
      pMVar5->refcount = (int *)0x0;
      *(undefined8 *)((long)&pMVar5->refcount + 4) = 0;
      *(undefined8 *)((long)&pMVar5->elemsize + 4) = 0;
      pMVar5->dims = 0;
      pMVar5->w = 0;
      pMVar5->h = 0;
      pMVar5->d = 0;
      pMVar5->c = 0;
      pMVar5->data = local_78.data;
      pMVar5->refcount = local_78.refcount;
      pMVar5->elemsize = local_78.elemsize;
      pMVar5->elempack = local_78.elempack;
      pMVar5->allocator = local_78.allocator;
      pMVar5->dims = local_78.dims;
      pMVar5->w = local_78.w;
      pMVar5->h = local_78.h;
      pMVar5->d = local_78.d;
      pMVar5->c = local_78.c;
      pMVar5->cstep = local_78.cstep;
    }
    if (local_78.refcount != (int *)0x0) {
      LOCK();
      *local_78.refcount = *local_78.refcount + -1;
      UNLOCK();
      if (*local_78.refcount == 0) {
        if (local_78.allocator == (Allocator *)0x0) {
          if (local_78.data != (void *)0x0) {
            free(local_78.data);
          }
        }
        else {
          (*(local_78.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  if (pMVar5->data == (void *)0x0) {
    iVar9 = -100;
  }
  else {
    iVar9 = -100;
    if ((long)pMVar5->c * pMVar5->cstep != 0) {
      iVar9 = 0;
    }
  }
  return iVar9;
}

Assistant:

int Reshape::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    Mat& top_blob = top_blobs[0];

    // resolve out shape
    int outw = w;
    int outh = h;
    int outd = d;
    int outc = c;

    if (!shape_expr.empty())
    {
        eval_shape_expr(bottom_blobs, outw, outh, outd, outc);
    }

    int total = bottom_blob.w * bottom_blob.h * bottom_blob.d * bottom_blob.c;

    int dims = bottom_blob.dims;

    if (ndim == 1)
    {
        if (outw == 0)
            outw = bottom_blob.w;

        if (outw == -1)
            outw = total;

        if (dims == 1 && bottom_blob.w == outw)
        {
            top_blob = bottom_blob;
            return 0;
        }
    }
    if (ndim == 2)
    {
        if (outw == 0)
            outw = bottom_blob.w;
        if (outh == 0)
            outh = bottom_blob.h;

        if (outw == -1)
            outw = total / outh;
        if (outh == -1)
            outh = total / outw;

        if (dims == 2 && bottom_blob.h == outh)
        {
            top_blob = bottom_blob;
            return 0;
        }
    }
    if (ndim == 3)
    {
        if (outw == 0)
            outw = bottom_blob.w;
        if (outh == 0)
            outh = bottom_blob.h;
        if (outc == 0)
            outc = bottom_blob.c;

        if (outw == -1)
            outw = total / outc / outh;
        if (outh == -1)
            outh = total / outc / outw;
        if (outc == -1)
            outc = total / outh / outw;

        if (dims == 3 && bottom_blob.c == outc)
        {
            top_blob = bottom_blob;
            top_blob.w = outw;
            top_blob.h = outh;
            return 0;
        }
    }
    if (ndim == 4)
    {
        if (outw == 0)
            outw = bottom_blob.w;
        if (outh == 0)
            outh = bottom_blob.h;
        if (outc == 0)
            outc = bottom_blob.c;
        if (outd == 0)
            outd = bottom_blob.d;

        if (outw == -1)
            outw = total / outc / outd / outh;
        if (outh == -1)
            outh = total / outc / outd / outw;
        if (outd == -1)
            outd = total / outc / outh / outw;
        if (outc == -1)
            outc = total / outd / outh / outw;

        if (dims == 4 && bottom_blob.c == outc)
        {
            top_blob = bottom_blob;
            top_blob.w = outw;
            top_blob.h = outh;
            top_blob.d = outd;
            return 0;
        }
    }

    if (ndim == 1)
    {
        top_blob = bottom_blob.reshape(outw, opt.blob_allocator);
    }
    if (ndim == 2)
    {
        top_blob = bottom_blob.reshape(outw, outh, opt.blob_allocator);
    }
    if (ndim == 3)
    {
        top_blob = bottom_blob.reshape(outw, outh, outc, opt.blob_allocator);
    }
    if (ndim == 4)
    {
        top_blob = bottom_blob.reshape(outw, outh, outd, outc, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    return 0;
}